

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_draw_update(t_gobj *client,_glist *glist)

{
  int iVar1;
  int iVar2;
  _glist *p_Var3;
  int *y1;
  char local_d8 [8];
  char tag [128];
  int val;
  int ypos;
  int xpos;
  _glist *canvas;
  int local_30;
  int zoom;
  int d;
  int c;
  int b;
  int a;
  t_slider *x;
  _glist *glist_local;
  t_gobj *client_local;
  
  _b = (t_slider *)client;
  x = (t_slider *)glist;
  glist_local = (_glist *)client;
  iVar2 = glist_isvisible(glist);
  if (iVar2 != 0) {
    iVar2 = ((_b->x_gui).x_glist)->gl_zoom;
    p_Var3 = glist_getcanvas((_glist *)x);
    text_xpix((t_text *)_b,(_glist *)x);
    text_ypix((t_text *)_b,(_glist *)x);
    iVar1 = _b->x_val;
    sprintf(local_d8,"%lxKNOB",_b);
    y1 = &local_30;
    slider_knob_position(_b,(_glist *)x,((iVar1 + 0x32) / 100) * iVar2,&c,&d,&zoom,y1);
    pdgui_vmess((char *)0x0,"crs iiii",p_Var3,"coords",local_d8,(ulong)(uint)c,
                CONCAT44((int)((ulong)y1 >> 0x20),d),zoom,local_30);
  }
  return;
}

Assistant:

static void slider_draw_update(t_gobj *client, t_glist *glist)
{
    t_slider *x = (t_slider *)client;
    int a, b, c, d;
    if (glist_isvisible(glist))
    {
        const int zoom = IEMGUI_ZOOM(x);
        t_canvas *canvas = glist_getcanvas(glist);
        int xpos = text_xpix(&x->x_gui.x_obj, glist);
        int ypos = text_ypix(&x->x_gui.x_obj, glist);
        int val = ((x->x_val + 50) / 100) * zoom;
        char tag[128];
        sprintf(tag, "%lxKNOB", x);

        slider_knob_position(x, glist, val, &a, &b, &c, &d);
        pdgui_vmess(0, "crs iiii", canvas, "coords", tag, a, b, c, d);
    }
}